

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsAddRef(JsRef ref,uint *count)

{
  Recycler *this;
  ScriptContext *pSVar1;
  bool bVar2;
  BOOL BVar3;
  ThreadContext *pTVar4;
  RecyclableObject *newRoot;
  TTDJsRTActionResultAutoRecorder local_68;
  AutoNestedHandledExceptionType local_58 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  uint local_2c [2];
  uint lCount;
  
  if (ref == (JsRef)0x0) {
    return JsErrorInvalidArgument;
  }
  if (count == (uint *)0x0) {
    bVar2 = Js::VarIs<Js::RecyclableObject>(ref);
    if (!bVar2) {
      return JsNoError;
    }
  }
  else {
    *count = 0;
    bVar2 = Js::VarIs<Js::RecyclableObject>(ref);
    if (!bVar2) {
      *count = 1;
      return JsNoError;
    }
  }
  bVar2 = JsrtContext::Is(ref);
  if (bVar2) {
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_58,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    Memory::Recycler::RootAddRef(*(Recycler **)(**(long **)((long)ref + 0x10) + 0x588),ref,count);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_58);
    return JsNoError;
  }
  pTVar4 = ThreadContext::GetContextForCurrentThread();
  if (pTVar4 == (ThreadContext *)0x0) {
    return JsErrorNoCurrentContext;
  }
  this = pTVar4->recycler;
  local_68.m_actionEvent = (EventLogEntry *)0x0;
  local_68.m_resultPtr = (TTDVar *)0x0;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_58,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  BVar3 = Memory::Recycler::IsValidObject(this,ref,0);
  if (BVar3 != 0) {
    local_2c[0] = 0;
    Memory::Recycler::RootAddRef(this,ref,local_2c);
    if (count != (uint *)0x0) {
      *count = local_2c[0];
    }
    if (((local_2c[0] == 1) && (pTVar4->TTDLog != (EventLog *)0x0)) &&
       (bVar2 = TTD::EventLog::IsPropertyRecordRef(pTVar4->TTDLog,ref), !bVar2)) {
      newRoot = Js::VarTo<Js::RecyclableObject>(ref);
      pSVar1 = (((((newRoot->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1->TTDRecordModeEnabled == true) {
        if (pSVar1->TTDShouldPerformRecordAction == true) {
          TTD::EventLog::RecordJsRTAddRootRef(pTVar4->TTDLog,&local_68,ref);
        }
        TTD::ThreadContextTTD::AddRootRef_Record(pTVar4->TTDContext,(TTD_LOG_PTR_ID)newRoot,newRoot)
        ;
      }
    }
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_58);
  if (local_68.m_actionEvent != (EventLogEntry *)0x0) {
    if ((local_68.m_actionEvent)->ResultStatus != -1) {
      TTDAbort_unrecoverable_error("Hmm this got changed somewhere???");
    }
    (local_68.m_actionEvent)->ResultStatus = 0;
    return JsNoError;
  }
  return JsNoError;
}

Assistant:

CHAKRA_API JsAddRef(_In_ JsRef ref, _Out_opt_ unsigned int *count)
{
    VALIDATE_JSREF(ref);
    if (count != nullptr)
    {
        *count = 0;
    }

    if (Js::TaggedNumber::Is(ref))
    {
        // The count is always one because these are never collected
        if (count)
        {
            *count = 1;
        }
        return JsNoError;
    }

    if (JsrtContext::Is(ref))
    {
        return GlobalAPIWrapper_NoRecord([&] () -> JsErrorCode
        {
            Recycler * recycler = static_cast<JsrtContext *>(ref)->GetRuntime()->GetThreadContext()->GetRecycler();
            recycler->RootAddRef(ref, count);
            return JsNoError;
        });
    }
    else
    {
        ThreadContext* threadContext = ThreadContext::GetContextForCurrentThread();
        if (threadContext == nullptr)
        {
            return JsErrorNoCurrentContext;
        }
        Recycler * recycler = threadContext->GetRecycler();
        return GlobalAPIWrapper([&] (TTDRecorder& _actionEntryPopper) -> JsErrorCode
        {
            // Note, some references may live in arena-allocated memory, so we need to do this check
            if (!recycler->IsValidObject(ref))
            {
                return JsNoError;
            }

#if ENABLE_TTD
            unsigned int lCount = 0;
            recycler->RootAddRef(ref, &lCount);
            if (count != nullptr)
            {
                *count = lCount;
            }

            if((lCount == 1) && (threadContext->IsRuntimeInTTDMode()) && (!threadContext->TTDLog->IsPropertyRecordRef(ref)))
            {
                Js::RecyclableObject* obj = Js::VarTo<Js::RecyclableObject>(ref);
                if(obj->GetScriptContext()->IsTTDRecordModeEnabled())
                {
                    if(obj->GetScriptContext()->ShouldPerformRecordAction())
                    {
                        threadContext->TTDLog->RecordJsRTAddRootRef(_actionEntryPopper, (Js::Var)ref);
                    }

                    threadContext->TTDContext->AddRootRef_Record(TTD_CONVERT_OBJ_TO_LOG_PTR_ID(obj), obj);
                }
            }
#else
            recycler->RootAddRef(ref, count);
#endif

            return JsNoError;
        });
    }
}